

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex_tree.cpp
# Opt level: O1

char RegexTree::parse_escape(char c)

{
  undefined3 in_register_00000039;
  int iVar1;
  
  iVar1 = CONCAT31(in_register_00000039,c);
  if (iVar1 == 0x6e) {
    return '\n';
  }
  if (iVar1 != 0x72) {
    if (iVar1 == 0x74) {
      iVar1 = 9;
    }
    return (char)iVar1;
  }
  return '\r';
}

Assistant:

char RegexTree::parse_escape(char c) {
    switch (c) {
        case 'n':
            return '\n';
        case 't':
            return '\t';
        case 'r':
            return '\r';
        default:
            return c;
    }
}